

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

ON_3dVector * __thiscall ON_Triangle::Normal(ON_3dVector *__return_storage_ptr__,ON_Triangle *this)

{
  double dVar1;
  undefined1 local_b8 [8];
  ON_3dVector W;
  ON_3dVector V;
  double normV;
  ON_Line local_70;
  undefined1 local_40 [8];
  ON_3dVector V_1;
  double dStack_20;
  int i;
  double max_len;
  int i0;
  ON_Triangle *this_local;
  
  max_len._4_4_ = 0;
  dStack_20 = -1.0;
  for (V_1.z._4_4_ = 0; V_1.z._4_4_ < 3; V_1.z._4_4_ = V_1.z._4_4_ + 1) {
    Edge(&local_70,this,V_1.z._4_4_);
    ON_Line::Direction((ON_3dVector *)local_40,&local_70);
    ON_Line::~ON_Line(&local_70);
    dVar1 = ON_3dVector::MaximumCoordinate((ON_3dVector *)local_40);
    if (dStack_20 < dVar1) {
      max_len._4_4_ = V_1.z._4_4_;
      dStack_20 = dVar1;
    }
  }
  ON_3dPoint::operator-
            ((ON_3dVector *)&W.z,this->m_V + (max_len._4_4_ + 1) % 3,this->m_V + max_len._4_4_);
  ON_3dPoint::operator-
            ((ON_3dVector *)local_b8,this->m_V + (max_len._4_4_ + 2) % 3,this->m_V + max_len._4_4_);
  ON_CrossProduct(__return_storage_ptr__,(ON_3dVector *)&W.z,(ON_3dVector *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Triangle::Normal() const
{
	int i0 = 0; // base vetex for computation s/b opposite longest side
									 // too minimize roundoff 
									 // ( see Kahan https://people.eecs.berkeley.edu/~wkahan/MathH110/Cross.pdf).
	double max_len = -1;
	for (int i = 0; i < 3; i++)
	{
		ON_3dVector V = Edge(i).Direction();
		double normV = V.MaximumCoordinate();
		if (normV > max_len)
		{
			max_len = normV;
			i0 = i;
		}
	}

	ON_3dVector V = m_V[(i0 + 1)%3] - m_V[i0];
	ON_3dVector W = m_V[(i0 + 2)%3] - m_V[i0];

	return ON_CrossProduct(V, W);
}